

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int selectExpander(Walker *pWalker,Select *p)

{
  byte *pbVar1;
  undefined1 *puVar2;
  Expr **ppWhere;
  char **ppcVar3;
  char cVar4;
  i16 iVar5;
  Parse *pParse;
  sqlite3 *db;
  SrcList *pList;
  ExprList *pList_00;
  sqlite3 *db_00;
  ExprList *pEVar6;
  ExprList *pEVar7;
  SrcList *pSVar8;
  Column *pCVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  Table *pTVar13;
  Select *pSVar14;
  Table **ppTVar15;
  Expr *pEVar16;
  SrcList_item *pSVar17;
  Expr *pEVar18;
  size_t sVar19;
  byte bVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  char *pcVar24;
  ulong uVar25;
  ExprList_item *pEVar26;
  int i_1;
  ExprList *pEList;
  long lVar27;
  char *pcVar28;
  char *pcVar29;
  Schema **ppSVar30;
  Parse *pParse_00;
  short sVar31;
  Table **ppTVar32;
  With *p_1;
  With *pWVar33;
  SrcList *pSVar34;
  long lVar35;
  Select *pSVar36;
  long lVar37;
  long lVar38;
  char *p_00;
  Select *pSVar39;
  ExprList *local_d8;
  long local_b8;
  char *local_b0;
  With *local_a8;
  uint local_88;
  ExprList_item *a;
  Token sColname;
  
  pParse = pWalker->pParse;
  db = pParse->db;
  uVar22 = p->selFlags;
  p->selFlags = uVar22 | 0x40;
  if (db->mallocFailed != '\0') {
    return 2;
  }
  pList = p->pSrc;
  if ((uVar22 & 0x40) != 0 || pList == (SrcList *)0x0) {
    return 1;
  }
  pList_00 = p->pEList;
  pWVar33 = p->pWith;
  if (pWVar33 != (With *)0x0) {
    pWVar33->pOuter = pParse->pWith;
    pParse->pWith = pWVar33;
  }
  sqlite3SrcListAssignCursors(pParse,pList);
  iVar11 = pList->nSrc;
  if (0 < iVar11) {
    iVar21 = 0;
    pSVar17 = pList->a;
    do {
      bVar20 = (pSVar17->fg).field_0x1;
      if ((bVar20 & 0x20) == 0) {
        if (pSVar17->zDatabase == (char *)0x0) {
          pParse_00 = pWalker->pParse;
          pWVar33 = pParse_00->pWith;
          if ((pWVar33 != (With *)0x0) && (pcVar29 = pSVar17->zName, pcVar29 != (char *)0x0)) {
            db_00 = pParse_00->db;
            do {
              iVar11 = pWVar33->nCte;
              if (0 < (long)iVar11) {
                lVar27 = 0;
LAB_00162d76:
                pcVar24 = *(char **)((long)&pWVar33->a[0].zName + lVar27);
                iVar12 = sqlite3StrICmp(pcVar29,pcVar24);
                if (iVar12 != 0) goto code_r0x00162d8a;
                pcVar28 = *(char **)((long)&pWVar33->a[0].zCteErr + lVar27);
                if (pcVar28 != (char *)0x0) goto LAB_00163983;
                if ((bVar20 & 4) != 0) {
                  pcVar28 = "\'%s\' is not a function";
                  pcVar24 = pcVar29;
                  goto LAB_00163983;
                }
                pTVar13 = (Table *)sqlite3DbMallocZero(db_00,0x80);
                pSVar17->pTab = pTVar13;
                if (pTVar13 == (Table *)0x0) {
                  return 2;
                }
                pTVar13->nTabRef = 1;
                pcVar29 = sqlite3DbStrDup(db_00,*(char **)((long)&pWVar33->a[0].zName + lVar27));
                pTVar13->zName = pcVar29;
                pTVar13->iPKey = -1;
                pTVar13->nRowLogEst = 200;
                *(byte *)&pTVar13->tabFlags = (byte)pTVar13->tabFlags | 0x42;
                pSVar14 = sqlite3SelectDup(db_00,*(Select **)((long)&pWVar33->a[0].pSelect + lVar27)
                                           ,0);
                pSVar17->pSelect = pSVar14;
                if (db_00->mallocFailed != '\0') {
                  return 2;
                }
                bVar20 = pSVar14->op + 0x8d;
                if (bVar20 < 2) {
                  pSVar8 = pSVar14->pSrc;
                  iVar11 = pSVar8->nSrc;
                  if (0 < (long)iVar11) {
                    lVar37 = 0;
                    do {
                      if (((*(long *)((long)&pSVar8->a[0].zDatabase + lVar37) == 0) &&
                          (pcVar29 = *(char **)((long)&pSVar8->a[0].zName + lVar37),
                          pcVar29 != (char *)0x0)) &&
                         (iVar12 = sqlite3StrICmp(pcVar29,*(char **)((long)&pWVar33->a[0].zName +
                                                                    lVar27)), iVar12 == 0)) {
                        *(Table **)((long)&pSVar8->a[0].pTab + lVar37) = pTVar13;
                        pbVar1 = &pSVar8->a[0].fg.field_0x1 + lVar37;
                        *pbVar1 = *pbVar1 | 0x20;
                        pTVar13->nTabRef = pTVar13->nTabRef + 1;
                        pbVar1 = (byte *)((long)&pSVar14->selFlags + 1);
                        *pbVar1 = *pbVar1 | 0x20;
                      }
                      lVar37 = lVar37 + 0x70;
                    } while ((long)iVar11 * 0x70 - lVar37 != 0);
                  }
                  if (2 < pTVar13->nTabRef) {
LAB_00163962:
                    pcVar28 = "multiple references to recursive table: %s";
                    pcVar24 = *(char **)((long)&pWVar33->a[0].zName + lVar27);
                    goto LAB_00163983;
                  }
                  *(char **)((long)&pWVar33->a[0].zCteErr + lVar27) = "circular reference: %s";
                  local_a8 = pParse_00->pWith;
                  pParse_00->pWith = pWVar33;
                  pSVar36 = pSVar14->pPrior;
                  pSVar36->pWith = pSVar14->pWith;
                  sqlite3WalkSelect(pWalker,pSVar36);
                  pSVar36->pWith = (With *)0x0;
                }
                else {
                  if (2 < pTVar13->nTabRef) goto LAB_00163962;
                  *(char **)((long)&pWVar33->a[0].zCteErr + lVar27) = "circular reference: %s";
                  local_a8 = pParse_00->pWith;
                  pParse_00->pWith = pWVar33;
                  sqlite3WalkSelect(pWalker,pSVar14);
                }
                pParse_00->pWith = pWVar33;
                pSVar36 = pSVar14;
                do {
                  pSVar39 = pSVar36;
                  pSVar36 = pSVar39->pPrior;
                } while (pSVar36 != (Select *)0x0);
                pEVar6 = pSVar39->pEList;
                pEVar7 = *(ExprList **)((long)&pWVar33->a[0].pCols + lVar27);
                pEList = pEVar6;
                if (((pEVar7 != (ExprList *)0x0) && (pEList = pEVar7, pEVar6 != (ExprList *)0x0)) &&
                   (pEVar6->nExpr != pEVar7->nExpr)) {
                  sqlite3ErrorMsg(pParse_00,"table %s has %d values for %d columns",
                                  *(undefined8 *)((long)&pWVar33->a[0].zName + lVar27));
                  pParse_00->pWith = local_a8;
                  return 2;
                }
                sqlite3ColumnsFromExprList
                          ((Parse *)pParse_00->db,pEList,&pTVar13->nCol,&pTVar13->aCol);
                if (bVar20 < 2) {
                  pcVar29 = "multiple recursive references: %s";
                  if ((pSVar14->selFlags >> 0xd & 1) == 0) {
                    pcVar29 = "recursive reference in a subquery: %s";
                  }
                  *(char **)((long)&pWVar33->a[0].zCteErr + lVar27) = pcVar29;
                  sqlite3WalkSelect(pWalker,pSVar14);
                }
                *(undefined8 *)((long)&pWVar33->a[0].zCteErr + lVar27) = 0;
                pParse_00->pWith = local_a8;
                break;
              }
LAB_00162d93:
              pWVar33 = pWVar33->pOuter;
            } while (pWVar33 != (With *)0x0);
          }
        }
        if (pSVar17->pTab == (Table *)0x0) {
          if (pSVar17->zName == (char *)0x0) {
            pSVar14 = pSVar17->pSelect;
            iVar11 = sqlite3WalkSelect(pWalker,pSVar14);
            if (iVar11 != 0) {
              return 2;
            }
            pTVar13 = (Table *)sqlite3DbMallocZero(db,0x80);
            pSVar17->pTab = pTVar13;
            if (pTVar13 == (Table *)0x0) {
              return 2;
            }
            pTVar13->nTabRef = 1;
            pcVar29 = sqlite3MPrintf(db,"sqlite_sq_%p",pTVar13);
            pTVar13->zName = pcVar29;
            do {
              pSVar36 = pSVar14;
              pSVar14 = pSVar36->pPrior;
            } while (pSVar14 != (Select *)0x0);
            sqlite3ColumnsFromExprList
                      ((Parse *)pParse->db,pSVar36->pEList,&pTVar13->nCol,&pTVar13->aCol);
            pTVar13->iPKey = -1;
            pTVar13->nRowLogEst = 200;
            *(byte *)&pTVar13->tabFlags = (byte)pTVar13->tabFlags | 2;
          }
          else {
            pTVar13 = sqlite3LocateTableItem(pParse,0,pSVar17);
            pSVar17->pTab = pTVar13;
            if (pTVar13 == (Table *)0x0) {
              return 2;
            }
            if (0xfffe < pTVar13->nTabRef) {
              sqlite3ErrorMsg(pParse,"too many references to \"%s\": max 65535",pTVar13->zName);
              pSVar17->pTab = (Table *)0x0;
              return 2;
            }
            pTVar13->nTabRef = pTVar13->nTabRef + 1;
            if (pTVar13->nModuleArg == 0) {
              if (((pSVar17->fg).field_0x1 & 4) != 0) {
                pcVar28 = "\'%s\' is not a function";
                pcVar24 = pSVar17->zName;
                pParse_00 = pParse;
LAB_00163983:
                sqlite3ErrorMsg(pParse_00,pcVar28,pcVar24);
                return 2;
              }
              if (pTVar13->pSelect == (Select *)0x0) goto LAB_00162f4e;
            }
            iVar11 = sqlite3ViewGetColumnNames(pParse,pTVar13);
            if (iVar11 != 0) {
              return 2;
            }
            pSVar14 = sqlite3SelectDup(db,pTVar13->pSelect,0);
            pSVar17->pSelect = pSVar14;
            iVar5 = pTVar13->nCol;
            pTVar13->nCol = -1;
            sqlite3WalkSelect(pWalker,pSVar14);
            pTVar13->nCol = iVar5;
          }
        }
LAB_00162f4e:
        iVar11 = sqlite3IndexedByLookup(pParse,pSVar17);
        if (iVar11 != 0) {
          return 2;
        }
        iVar11 = pList->nSrc;
      }
      iVar21 = iVar21 + 1;
      pSVar17 = pSVar17 + 1;
    } while (iVar21 < iVar11);
  }
  if (db->mallocFailed != '\0') {
    return 2;
  }
  pSVar8 = p->pSrc;
  if (1 < pSVar8->nSrc) {
    pSVar17 = pSVar8->a;
    pSVar34 = pSVar8 + 1;
    ppWhere = &p->pWhere;
    ppTVar15 = &pSVar8->a[0].pTab;
    lVar27 = 0;
    do {
      pTVar13 = (Table *)pSVar34->a[0].zAlias;
      if (pTVar13 != (Table *)0x0 && pSVar17->pTab != (Table *)0x0) {
        bVar20 = (byte)pSVar34->a[0].regReturn;
        uVar22 = (bVar20 & 0x20) >> 5;
        if ((bVar20 & 4) != 0) {
          lVar37._0_1_ = pSVar34->a[0].iSelectId;
          lVar37._1_3_ = *(undefined3 *)&pSVar34->a[0].field_0x41;
          lVar37._4_4_ = pSVar34->a[0].iCursor;
          if ((lVar37 != 0) || (pSVar34->a[0].pOn != (Expr *)0x0)) {
            sqlite3ErrorMsg(pParse,"a NATURAL join may not have an ON or USING clause",0);
            return 2;
          }
          sVar31 = pTVar13->nCol;
          if (0 < sVar31) {
            lVar37 = 0;
            do {
              pcVar29 = pTVar13->aCol[lVar37].zName;
              lVar35 = 0;
              ppTVar32 = ppTVar15;
              do {
                iVar11 = columnIndex(*ppTVar32,pcVar29);
                if (-1 < iVar11) {
                  addWhereTerm(pParse,pSVar8,(int)lVar35,iVar11,(int)lVar27 + 1,(int)lVar37,uVar22,
                               ppWhere);
                  sVar31 = pTVar13->nCol;
                  break;
                }
                lVar35 = lVar35 + 1;
                ppTVar32 = ppTVar32 + 0xe;
              } while (lVar27 + 1 != lVar35);
              lVar37 = lVar37 + 1;
            } while (lVar37 < sVar31);
          }
        }
        pEVar16 = *(Expr **)&pSVar34->a[0].iSelectId;
        if (pEVar16 != (Expr *)0x0) {
          if (pSVar34->a[0].pOn != (Expr *)0x0) {
            pcVar29 = "cannot have both ON and USING clauses in the same join";
            goto LAB_00163917;
          }
          if ((bVar20 & 0x20) != 0) {
            setJoinExpr(pEVar16,(int)pSVar34->a[0].fg);
            pEVar16 = *(Expr **)&pSVar34->a[0].iSelectId;
          }
          pEVar16 = sqlite3ExprAnd(pParse->db,*ppWhere,pEVar16);
          *ppWhere = pEVar16;
          pSVar34->a[0].iSelectId = '\0';
          *(undefined3 *)&pSVar34->a[0].field_0x41 = 0;
          pSVar34->a[0].iCursor = 0;
        }
        pEVar16 = pSVar34->a[0].pOn;
        if ((pEVar16 != (Expr *)0x0) && (0 < (pEVar16->u).iValue)) {
          lVar37 = 0;
          do {
            pcVar24 = *(char **)(*(long *)pEVar16 + lVar37 * 0x10);
            iVar11 = columnIndex(pTVar13,pcVar24);
            if (iVar11 < 0) {
LAB_001633cc:
              pcVar28 = "cannot join using column %s - column not present in both tables";
              pParse_00 = pParse;
              goto LAB_00163983;
            }
            lVar35 = 0;
            ppTVar32 = ppTVar15;
            while (iVar21 = columnIndex(*ppTVar32,pcVar24), iVar21 < 0) {
              lVar35 = lVar35 + 1;
              ppTVar32 = ppTVar32 + 0xe;
              if (lVar27 + 1 == lVar35) goto LAB_001633cc;
            }
            addWhereTerm(pParse,pSVar8,(int)lVar35,iVar21,(int)lVar27 + 1,iVar11,uVar22,ppWhere);
            lVar37 = lVar37 + 1;
          } while (lVar37 < (pEVar16->u).iValue);
        }
      }
      lVar27 = lVar27 + 1;
      pSVar34 = (SrcList *)&pSVar34->a[0].pIBIndex;
      pSVar17 = pSVar17 + 1;
    } while (lVar27 < (long)pSVar8->nSrc + -1);
  }
  if (0 < (long)pList_00->nExpr) {
    lVar27 = 0;
    do {
      pcVar29 = *(char **)((long)&pList_00->a[0].pExpr + lVar27);
      cVar4 = *pcVar29;
      if (cVar4 == 'z') {
        cVar4 = **(char **)(pcVar29 + 0x18);
      }
      if (cVar4 == -0x5f) {
        local_88 = pParse->db->flags & 0x44;
        lVar27 = 0;
        local_d8 = (ExprList *)0x0;
        goto LAB_001633f8;
      }
      lVar27 = lVar27 + 0x20;
    } while ((long)pList_00->nExpr * 0x20 != lVar27);
  }
  local_d8 = p->pEList;
  goto LAB_001638f5;
code_r0x00162d8a:
  lVar27 = lVar27 + 0x20;
  if ((long)iVar11 * 0x20 == lVar27) goto LAB_00162d93;
  goto LAB_00162d76;
LAB_001633f8:
  do {
    pEVar16 = pList_00->a[lVar27].pExpr;
    if (pEVar16->op == 0xa1) {
      pcVar29 = (char *)0x0;
LAB_0016347f:
      iVar11 = pList->nSrc;
      if (0 < iVar11) {
        local_b8 = 0;
        lVar37 = 0;
        bVar10 = false;
        pSVar17 = pList->a;
        do {
          local_b0 = pSVar17->zAlias;
          pTVar13 = pSVar17->pTab;
          if (local_b0 == (char *)0x0) {
            local_b0 = pTVar13->zName;
          }
          if (db->mallocFailed != '\0') break;
          pSVar14 = pSVar17->pSelect;
          if ((pSVar14 == (Select *)0x0) || ((pSVar14->selFlags & 0x800) == 0)) {
            if ((pcVar29 == (char *)0x0) || (iVar21 = sqlite3StrICmp(pcVar29,local_b0), iVar21 == 0)
               ) {
              if (pTVar13->pSchema == (Schema *)0x0) {
LAB_0016354b:
                pcVar24 = "*";
              }
              else {
                uVar22 = db->nDb;
                if ((int)uVar22 < 1) {
                  uVar25 = 0;
                }
                else {
                  ppSVar30 = &db->aDb->pSchema;
                  uVar23 = 0;
                  do {
                    uVar25 = uVar23;
                    if (*ppSVar30 == pTVar13->pSchema) break;
                    uVar23 = uVar23 + 1;
                    ppSVar30 = ppSVar30 + 4;
                    uVar25 = (ulong)uVar22;
                  } while (uVar22 != uVar23);
                  if ((int)uVar25 < 0) goto LAB_0016354b;
                }
                pcVar24 = db->aDb[uVar25 & 0xffffffff].zDbSName;
              }
              pSVar14 = (Select *)0x0;
              goto LAB_00163572;
            }
          }
          else {
            pcVar24 = (char *)0x0;
LAB_00163572:
            if (0 < pTVar13->nCol) {
              lVar35 = 0;
              do {
                pCVar9 = pTVar13->aCol;
                pcVar28 = pCVar9[lVar35].zName;
                if (((pSVar14 == (Select *)0x0 || pcVar29 == (char *)0x0) ||
                    (iVar11 = sqlite3MatchSpanName
                                        (pSVar14->pEList->a[lVar35].zSpan,(char *)0x0,pcVar29,
                                         (char *)0x0), iVar11 != 0)) &&
                   (((p->selFlags & 0x20000) != 0 || ((pCVar9[lVar35].colFlags & 2) == 0)))) {
                  if (lVar37 != 0 && pcVar29 == (char *)0x0) {
                    if (((pSVar17->fg).jointype & 4) != 0) {
                      lVar38 = 0;
                      do {
                        iVar11 = columnIndex(*(Table **)((long)&pList->a[0].pTab + lVar38),pcVar28);
                        if (-1 < iVar11) {
                          bVar10 = true;
                          goto LAB_0016382a;
                        }
                        lVar38 = lVar38 + 0x70;
                      } while (local_b8 != lVar38);
                    }
                    iVar11 = sqlite3IdListIndex(pSVar17->pUsing,pcVar28);
                    bVar10 = true;
                    if (-1 < iVar11) goto LAB_0016382a;
                  }
                  pEVar16 = sqlite3Expr(db,0x1b,pcVar28);
                  if ((local_88 == 4) || (1 < pList->nSrc)) {
                    pEVar18 = sqlite3Expr(db,0x1b,local_b0);
                    pEVar16 = sqlite3PExpr(pParse,0x7a,pEVar18,pEVar16);
                    if (pcVar24 != (char *)0x0) {
                      sColname.z = pcVar24;
                      sVar19 = strlen(pcVar24);
                      sColname.n = (uint)sVar19 & 0x3fffffff;
                      pEVar18 = sqlite3ExprAlloc(db,0x1b,&sColname,0);
                      pEVar16 = sqlite3PExpr(pParse,0x7a,pEVar18,pEVar16);
                    }
                    if (local_88 == 4) {
                      pcVar28 = sqlite3MPrintf(db,"%s.%s",local_b0);
                      p_00 = pcVar28;
                    }
                    else {
                      p_00 = (char *)0x0;
                    }
                  }
                  else {
                    p_00 = (char *)0x0;
                  }
                  local_d8 = sqlite3ExprListAppend((Parse *)pParse->db,local_d8,pEVar16);
                  sColname.z = pcVar28;
                  if (pcVar28 == (char *)0x0) {
                    sColname.n = 0;
                  }
                  else {
                    sVar19 = strlen(pcVar28);
                    sColname.n = (uint)sVar19 & 0x3fffffff;
                  }
                  sqlite3ExprListSetName(pParse,local_d8,&sColname,0);
                  if ((local_d8 != (ExprList *)0x0) && ((p->selFlags & 0x800) != 0)) {
                    iVar11 = local_d8->nExpr;
                    if (pSVar14 == (Select *)0x0) {
                      pcVar28 = sqlite3MPrintf(db,"%s.%s.%s",pcVar24,local_b0,pcVar28);
                    }
                    else {
                      pcVar28 = sqlite3DbStrDup(db,pSVar14->pEList->a[lVar35].zSpan);
                    }
                    local_d8->a[(long)iVar11 + -1].zSpan = pcVar28;
                    puVar2 = &local_d8->a[(long)iVar11 + -1].field_0x19;
                    *puVar2 = *puVar2 | 2;
                  }
                  bVar10 = true;
                  if (p_00 != (char *)0x0) {
                    sqlite3DbFreeNN(db,p_00);
                  }
                }
LAB_0016382a:
                lVar35 = lVar35 + 1;
              } while (lVar35 < pTVar13->nCol);
              iVar11 = pList->nSrc;
            }
          }
          lVar37 = lVar37 + 1;
          pSVar17 = pSVar17 + 1;
          local_b8 = local_b8 + 0x70;
        } while (lVar37 < iVar11);
        if (bVar10) goto LAB_001638c9;
      }
      if (pcVar29 == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"no tables specified");
      }
      else {
        sqlite3ErrorMsg(pParse,"no such table: %s",pcVar29);
      }
    }
    else {
      if ((pEVar16->op == 'z') && (pEVar16->pRight->op == 0xa1)) {
        pcVar29 = (pEVar16->pLeft->u).zToken;
        goto LAB_0016347f;
      }
      pEVar26 = pList_00->a + lVar27;
      local_d8 = sqlite3ExprListAppend((Parse *)pParse->db,local_d8,pEVar16);
      if (local_d8 != (ExprList *)0x0) {
        pcVar29 = pEVar26->zSpan;
        ppcVar3 = &local_d8->a[(long)local_d8->nExpr + -1].zName;
        *ppcVar3 = pEVar26->zName;
        ppcVar3[1] = pcVar29;
        pEVar26->zName = (char *)0x0;
        pEVar26->zSpan = (char *)0x0;
      }
      pEVar26->pExpr = (Expr *)0x0;
    }
LAB_001638c9:
    lVar27 = lVar27 + 1;
  } while (lVar27 < pList_00->nExpr);
  exprListDeleteNN(db,pList_00);
  p->pEList = local_d8;
LAB_001638f5:
  if (local_d8 == (ExprList *)0x0) {
    return 0;
  }
  if (local_d8->nExpr <= db->aLimit[2]) {
    return 0;
  }
  pcVar29 = "too many columns in result set";
LAB_00163917:
  sqlite3ErrorMsg(pParse,pcVar29);
  return 2;
}

Assistant:

static int selectExpander(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  int i, j, k;
  SrcList *pTabList;
  ExprList *pEList;
  struct SrcList_item *pFrom;
  sqlite3 *db = pParse->db;
  Expr *pE, *pRight, *pExpr;
  u16 selFlags = p->selFlags;

  p->selFlags |= SF_Expanded;
  if( db->mallocFailed  ){
    return WRC_Abort;
  }
  if( NEVER(p->pSrc==0) || (selFlags & SF_Expanded)!=0 ){
    return WRC_Prune;
  }
  pTabList = p->pSrc;
  pEList = p->pEList;
  if( p->pWith ){
    sqlite3WithPush(pParse, p->pWith, 0);
  }

  /* Make sure cursor numbers have been assigned to all entries in
  ** the FROM clause of the SELECT statement.
  */
  sqlite3SrcListAssignCursors(pParse, pTabList);

  /* Look up every table named in the FROM clause of the select.  If
  ** an entry of the FROM clause is a subquery instead of a table or view,
  ** then create a transient table structure to describe the subquery.
  */
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab;
    assert( pFrom->fg.isRecursive==0 || pFrom->pTab!=0 );
    if( pFrom->fg.isRecursive ) continue;
    assert( pFrom->pTab==0 );
#ifndef SQLITE_OMIT_CTE
    if( withExpand(pWalker, pFrom) ) return WRC_Abort;
    if( pFrom->pTab ) {} else
#endif
    if( pFrom->zName==0 ){
#ifndef SQLITE_OMIT_SUBQUERY
      Select *pSel = pFrom->pSelect;
      /* A sub-query in the FROM clause of a SELECT */
      assert( pSel!=0 );
      assert( pFrom->pTab==0 );
      if( sqlite3WalkSelect(pWalker, pSel) ) return WRC_Abort;
      pFrom->pTab = pTab = sqlite3DbMallocZero(db, sizeof(Table));
      if( pTab==0 ) return WRC_Abort;
      pTab->nTabRef = 1;
      pTab->zName = sqlite3MPrintf(db, "sqlite_sq_%p", (void*)pTab);
      while( pSel->pPrior ){ pSel = pSel->pPrior; }
      sqlite3ColumnsFromExprList(pParse, pSel->pEList,&pTab->nCol,&pTab->aCol);
      pTab->iPKey = -1;
      pTab->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
      pTab->tabFlags |= TF_Ephemeral;
#endif
    }else{
      /* An ordinary table or view name in the FROM clause */
      assert( pFrom->pTab==0 );
      pFrom->pTab = pTab = sqlite3LocateTableItem(pParse, 0, pFrom);
      if( pTab==0 ) return WRC_Abort;
      if( pTab->nTabRef>=0xffff ){
        sqlite3ErrorMsg(pParse, "too many references to \"%s\": max 65535",
           pTab->zName);
        pFrom->pTab = 0;
        return WRC_Abort;
      }
      pTab->nTabRef++;
      if( !IsVirtual(pTab) && cannotBeFunction(pParse, pFrom) ){
        return WRC_Abort;
      }
#if !defined(SQLITE_OMIT_VIEW) || !defined (SQLITE_OMIT_VIRTUALTABLE)
      if( IsVirtual(pTab) || pTab->pSelect ){
        i16 nCol;
        if( sqlite3ViewGetColumnNames(pParse, pTab) ) return WRC_Abort;
        assert( pFrom->pSelect==0 );
        pFrom->pSelect = sqlite3SelectDup(db, pTab->pSelect, 0);
        sqlite3SelectSetName(pFrom->pSelect, pTab->zName);
        nCol = pTab->nCol;
        pTab->nCol = -1;
        sqlite3WalkSelect(pWalker, pFrom->pSelect);
        pTab->nCol = nCol;
      }
#endif
    }

    /* Locate the index named by the INDEXED BY clause, if any. */
    if( sqlite3IndexedByLookup(pParse, pFrom) ){
      return WRC_Abort;
    }
  }

  /* Process NATURAL keywords, and ON and USING clauses of joins.
  */
  if( db->mallocFailed || sqliteProcessJoin(pParse, p) ){
    return WRC_Abort;
  }

  /* For every "*" that occurs in the column list, insert the names of
  ** all columns in all tables.  And for every TABLE.* insert the names
  ** of all columns in TABLE.  The parser inserted a special expression
  ** with the TK_ASTERISK operator for each "*" that it found in the column
  ** list.  The following code just has to locate the TK_ASTERISK
  ** expressions and expand each one to the list of all columns in
  ** all tables.
  **
  ** The first loop just checks to see if there are any "*" operators
  ** that need expanding.
  */
  for(k=0; k<pEList->nExpr; k++){
    pE = pEList->a[k].pExpr;
    if( pE->op==TK_ASTERISK ) break;
    assert( pE->op!=TK_DOT || pE->pRight!=0 );
    assert( pE->op!=TK_DOT || (pE->pLeft!=0 && pE->pLeft->op==TK_ID) );
    if( pE->op==TK_DOT && pE->pRight->op==TK_ASTERISK ) break;
  }
  if( k<pEList->nExpr ){
    /*
    ** If we get here it means the result set contains one or more "*"
    ** operators that need to be expanded.  Loop through each expression
    ** in the result set and expand them one by one.
    */
    struct ExprList_item *a = pEList->a;
    ExprList *pNew = 0;
    int flags = pParse->db->flags;
    int longNames = (flags & SQLITE_FullColNames)!=0
                      && (flags & SQLITE_ShortColNames)==0;

    for(k=0; k<pEList->nExpr; k++){
      pE = a[k].pExpr;
      pRight = pE->pRight;
      assert( pE->op!=TK_DOT || pRight!=0 );
      if( pE->op!=TK_ASTERISK
       && (pE->op!=TK_DOT || pRight->op!=TK_ASTERISK)
      ){
        /* This particular expression does not need to be expanded.
        */
        pNew = sqlite3ExprListAppend(pParse, pNew, a[k].pExpr);
        if( pNew ){
          pNew->a[pNew->nExpr-1].zName = a[k].zName;
          pNew->a[pNew->nExpr-1].zSpan = a[k].zSpan;
          a[k].zName = 0;
          a[k].zSpan = 0;
        }
        a[k].pExpr = 0;
      }else{
        /* This expression is a "*" or a "TABLE.*" and needs to be
        ** expanded. */
        int tableSeen = 0;      /* Set to 1 when TABLE matches */
        char *zTName = 0;       /* text of name of TABLE */
        if( pE->op==TK_DOT ){
          assert( pE->pLeft!=0 );
          assert( !ExprHasProperty(pE->pLeft, EP_IntValue) );
          zTName = pE->pLeft->u.zToken;
        }
        for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
          Table *pTab = pFrom->pTab;
          Select *pSub = pFrom->pSelect;
          char *zTabName = pFrom->zAlias;
          const char *zSchemaName = 0;
          int iDb;
          if( zTabName==0 ){
            zTabName = pTab->zName;
          }
          if( db->mallocFailed ) break;
          if( pSub==0 || (pSub->selFlags & SF_NestedFrom)==0 ){
            pSub = 0;
            if( zTName && sqlite3StrICmp(zTName, zTabName)!=0 ){
              continue;
            }
            iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
            zSchemaName = iDb>=0 ? db->aDb[iDb].zDbSName : "*";
          }
          for(j=0; j<pTab->nCol; j++){
            char *zName = pTab->aCol[j].zName;
            char *zColname;  /* The computed column name */
            char *zToFree;   /* Malloced string that needs to be freed */
            Token sColname;  /* Computed column name as a token */

            assert( zName );
            if( zTName && pSub
             && sqlite3MatchSpanName(pSub->pEList->a[j].zSpan, 0, zTName, 0)==0
            ){
              continue;
            }

            /* If a column is marked as 'hidden', omit it from the expanded
            ** result-set list unless the SELECT has the SF_IncludeHidden
            ** bit set.
            */
            if( (p->selFlags & SF_IncludeHidden)==0
             && IsHiddenColumn(&pTab->aCol[j]) 
            ){
              continue;
            }
            tableSeen = 1;

            if( i>0 && zTName==0 ){
              if( (pFrom->fg.jointype & JT_NATURAL)!=0
                && tableAndColumnIndex(pTabList, i, zName, 0, 0)
              ){
                /* In a NATURAL join, omit the join columns from the 
                ** table to the right of the join */
                continue;
              }
              if( sqlite3IdListIndex(pFrom->pUsing, zName)>=0 ){
                /* In a join with a USING clause, omit columns in the
                ** using clause from the table on the right. */
                continue;
              }
            }
            pRight = sqlite3Expr(db, TK_ID, zName);
            zColname = zName;
            zToFree = 0;
            if( longNames || pTabList->nSrc>1 ){
              Expr *pLeft;
              pLeft = sqlite3Expr(db, TK_ID, zTabName);
              pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pRight);
              if( zSchemaName ){
                pLeft = sqlite3Expr(db, TK_ID, zSchemaName);
                pExpr = sqlite3PExpr(pParse, TK_DOT, pLeft, pExpr);
              }
              if( longNames ){
                zColname = sqlite3MPrintf(db, "%s.%s", zTabName, zName);
                zToFree = zColname;
              }
            }else{
              pExpr = pRight;
            }
            pNew = sqlite3ExprListAppend(pParse, pNew, pExpr);
            sqlite3TokenInit(&sColname, zColname);
            sqlite3ExprListSetName(pParse, pNew, &sColname, 0);
            if( pNew && (p->selFlags & SF_NestedFrom)!=0 ){
              struct ExprList_item *pX = &pNew->a[pNew->nExpr-1];
              if( pSub ){
                pX->zSpan = sqlite3DbStrDup(db, pSub->pEList->a[j].zSpan);
                testcase( pX->zSpan==0 );
              }else{
                pX->zSpan = sqlite3MPrintf(db, "%s.%s.%s",
                                           zSchemaName, zTabName, zColname);
                testcase( pX->zSpan==0 );
              }
              pX->bSpanIsTab = 1;
            }
            sqlite3DbFree(db, zToFree);
          }
        }
        if( !tableSeen ){
          if( zTName ){
            sqlite3ErrorMsg(pParse, "no such table: %s", zTName);
          }else{
            sqlite3ErrorMsg(pParse, "no tables specified");
          }
        }
      }
    }
    sqlite3ExprListDelete(db, pEList);
    p->pEList = pNew;
  }
#if SQLITE_MAX_COLUMN
  if( p->pEList && p->pEList->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns in result set");
    return WRC_Abort;
  }
#endif
  return WRC_Continue;
}